

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O3

int uv_set_process_title(char *title)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t __n;
  
  sVar3 = strlen(title);
  uv_once(&process_title_mutex_once,init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);
  uVar2 = process_title_2;
  pvVar1 = process_title_0;
  __n = 0;
  if (process_title_2 != 0) {
    __n = process_title_2 - 1;
  }
  if (sVar3 < process_title_2) {
    __n = sVar3;
  }
  memcpy(process_title_0,title,__n);
  memset((void *)((long)pvVar1 + __n),0,uVar2 - __n);
  process_title_1 = __n;
  uv_mutex_unlock(&process_title_mutex);
  return 0;
}

Assistant:

int uv_set_process_title(const char* title) {
  struct uv__process_title* pt;
  size_t len;

  pt = &process_title;
  len = strlen(title);

  uv_once(&process_title_mutex_once, init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);

  if (len >= pt->cap) {
    len = 0;
    if (pt->cap > 0)
      len = pt->cap - 1;
  }

  memcpy(pt->str, title, len);
  memset(pt->str + len, '\0', pt->cap - len);
  pt->len = len;

  uv_mutex_unlock(&process_title_mutex);

  return 0;
}